

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O0

void testwin2(wins *wins_ar,int ar_len)

{
  char *local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  Am_Style *local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined4 local_68;
  undefined8 local_60;
  Am_Style *local_58;
  Am_Drawonable *local_50;
  undefined1 *local_48;
  Am_Drawonable *local_40;
  Am_Style local_28 [8];
  Am_Drawonable *local_20;
  Am_Drawonable *the_d2;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  the_d2._4_4_ = ar_len;
  _i = wins_ar;
  for (the_d2._0_4_ = 0; (int)the_d2 < the_d2._4_4_; the_d2._0_4_ = (int)the_d2 + 1) {
    local_50 = _i[(int)the_d2].root;
    local_58 = local_28;
    Am_Style::Am_Style(local_58,(Am_Style *)&green);
    local_b0 = local_58;
    local_c8 = "D2 Icon";
    local_60 = 0;
    local_68 = 1;
    local_70 = 0;
    local_78 = 0;
    local_80 = 0;
    local_88 = 0;
    local_90 = 0;
    local_98 = 1;
    local_a0 = 1;
    local_a8 = 0;
    local_b8 = 0;
    local_c0 = 1;
    local_48 = (undefined1 *)&local_c8;
    local_40 = (Am_Drawonable *)
               (*(code *)**(undefined8 **)local_50)(local_50,0x366,0x50,200,200,"D2");
    Am_Style::~Am_Style(local_28);
    local_20 = local_40;
    _i[(int)the_d2].d2 = local_40;
    local_c8._0_4_ = 0x32;
    local_c0 = 0;
    (**(code **)(*(long *)local_40 + 0x160))(local_40,&Am_No_Style,&blue,2,10,0x1e);
    local_c8 = (char *)CONCAT44(local_c8._4_4_,0x14);
    local_c0 = 0;
    (**(code **)(*(long *)local_20 + 0x160))(local_20,&black,&Am_No_Style,2,0x46,0x14);
    (**(code **)(*(long *)local_20 + 0xa0))();
  }
  return;
}

Assistant:

void
testwin2(wins *wins_ar, int ar_len)
{
  //printf("Hit RETURN to bring up green borderless window:");
  //getchar();
  int i;
  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *the_d2 = wins_ar[i].root->Create(
        TESTWINPROPS_D2_LEFT, TESTWINPROPS_D2_TOP, 200, 200, "D2", "D2 Icon",
        true, false, green, false, 1, 1, 0, 0,
        // No title bar
        false);
    wins_ar[i].d2 = the_d2;
    the_d2->Draw_Rectangle(Am_No_Style, blue, 2, 10, 30, 50);
    the_d2->Draw_Rectangle(black, Am_No_Style, 2, 70, 20, 20);
    the_d2->Flush_Output();
  }
}